

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapimpl.cpp
# Opt level: O0

int32_t unorm_swap(UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *__src;
  void *__dest;
  int32_t size;
  int32_t count;
  int32_t offset;
  int32_t i;
  int32_t indexes [32];
  int32_t *inIndexes;
  uint8_t *outBytes;
  uint8_t *inBytes;
  int32_t headerSize;
  UDataInfo *pInfo;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  iVar2 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    ds_local._4_4_ = 0;
  }
  else if ((((*(char *)((long)inData + 0xc) == 'N') && (*(char *)((long)inData + 0xd) == 'o')) &&
           (*(char *)((long)inData + 0xe) == 'r')) &&
          ((*(char *)((long)inData + 0xf) == 'm' && (*(char *)((long)inData + 0x10) == '\x02')))) {
    __src = (void *)((long)inData + (long)iVar2);
    __dest = (void *)((long)outData + (long)iVar2);
    outData_local._4_4_ = length;
    if ((length < 0) || (outData_local._4_4_ = length - iVar2, 0x7f < (int)outData_local._4_4_)) {
      for (count = 0; count < 0x20; count = count + 1) {
        iVar3 = udata_readInt32_63(ds,*(int32_t *)((long)__src + (long)count * 4));
        (&offset)[count] = iVar3;
      }
      iVar4 = offset + 0x80 + i * 2 + indexes[0] * 2 + indexes[8] + indexes[9] + indexes[10] * 2;
      if (-1 < (int)outData_local._4_4_) {
        if ((int)outData_local._4_4_ < iVar4) {
          udata_printError_63(ds,
                              "unorm_swap(): too few bytes (%d after header) for all of unorm.icu\n"
                              ,(ulong)outData_local._4_4_);
          *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          return 0;
        }
        if (__src != __dest) {
          memcpy(__dest,__src,(long)iVar4);
        }
        (*ds->swapArray32)(ds,__src,0x80,__dest,pErrorCode);
        utrie_swap_63(ds,(void *)((long)__src + 0x80),offset,(void *)((long)__dest + 0x80),
                      pErrorCode);
        iVar5 = offset + 0x80;
        iVar6 = (i + indexes[0]) * 2;
        (*ds->swapArray16)(ds,(void *)((long)__src + (long)iVar5),iVar6,
                           (void *)((long)__dest + (long)iVar5),pErrorCode);
        size = iVar6 + iVar5;
        if (indexes[8] != 0) {
          utrie_swap_63(ds,(void *)((long)__src + (long)size),indexes[8],
                        (void *)((long)__dest + (long)size),pErrorCode);
          size = indexes[8] + size;
        }
        if (indexes[9] != 0) {
          utrie_swap_63(ds,(void *)((long)__src + (long)size),indexes[9],
                        (void *)((long)__dest + (long)size),pErrorCode);
          size = indexes[9] + size;
        }
        (*ds->swapArray16)(ds,(void *)((long)__src + (long)size),indexes[10] << 1,
                           (void *)((long)__dest + (long)size),pErrorCode);
      }
      ds_local._4_4_ = iVar2 + iVar4;
    }
    else {
      udata_printError_63(ds,"unorm_swap(): too few bytes (%d after header) for unorm.icu\n",
                          (ulong)outData_local._4_4_);
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      ds_local._4_4_ = 0;
    }
  }
  else {
    udata_printError_63(ds,
                        "unorm_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as unorm.icu\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)*(byte *)((long)inData + 0xd),
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (uint)*(byte *)((long)inData + 0x10));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    ds_local._4_4_ = 0;
  }
  return ds_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
unorm_swap(const UDataSwapper *ds,
           const void *inData, int32_t length, void *outData,
           UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    const int32_t *inIndexes;
    int32_t indexes[32];

    int32_t i, offset, count, size;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x4e &&   /* dataFormat="Norm" */
        pInfo->dataFormat[1]==0x6f &&
        pInfo->dataFormat[2]==0x72 &&
        pInfo->dataFormat[3]==0x6d &&
        pInfo->formatVersion[0]==2
    )) {
        udata_printError(ds, "unorm_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as unorm.icu\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;

    inIndexes=(const int32_t *)inBytes;

    if(length>=0) {
        length-=headerSize;
        if(length<32*4) {
            udata_printError(ds, "unorm_swap(): too few bytes (%d after header) for unorm.icu\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    /* read the first 32 indexes (ICU 2.8/format version 2.2: _NORM_INDEX_TOP==32, might grow) */
    for(i=0; i<32; ++i) {
        indexes[i]=udata_readInt32(ds, inIndexes[i]);
    }

    /* calculate the total length of the data */
    size=
        32*4+ /* size of indexes[] */
        indexes[_NORM_INDEX_TRIE_SIZE]+
        indexes[_NORM_INDEX_UCHAR_COUNT]*2+
        indexes[_NORM_INDEX_COMBINE_DATA_COUNT]*2+
        indexes[_NORM_INDEX_FCD_TRIE_SIZE]+
        indexes[_NORM_INDEX_AUX_TRIE_SIZE]+
        indexes[_NORM_INDEX_CANON_SET_COUNT]*2;

    if(length>=0) {
        if(length<size) {
            udata_printError(ds, "unorm_swap(): too few bytes (%d after header) for all of unorm.icu\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        /* copy the data for inaccessible bytes */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, size);
        }

        offset=0;

        /* swap the indexes[] */
        count=32*4;
        ds->swapArray32(ds, inBytes, count, outBytes, pErrorCode);
        offset+=count;

        /* swap the main UTrie */
        count=indexes[_NORM_INDEX_TRIE_SIZE];
        utrie_swap(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        offset+=count;

        /* swap the uint16_t extraData[] and the uint16_t combiningTable[] */
        count=(indexes[_NORM_INDEX_UCHAR_COUNT]+indexes[_NORM_INDEX_COMBINE_DATA_COUNT])*2;
        ds->swapArray16(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        offset+=count;

        /* swap the FCD UTrie */
        count=indexes[_NORM_INDEX_FCD_TRIE_SIZE];
        if(count!=0) {
            utrie_swap(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
            offset+=count;
        }

        /* swap the aux UTrie */
        count=indexes[_NORM_INDEX_AUX_TRIE_SIZE];
        if(count!=0) {
            utrie_swap(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
            offset+=count;
        }

        /* swap the uint16_t combiningTable[] */
        count=indexes[_NORM_INDEX_CANON_SET_COUNT]*2;
        ds->swapArray16(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        offset+=count;
    }

    return headerSize+size;
}